

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStg.c
# Opt level: O0

void Gia_ManStgPrint(FILE *pFile,Vec_Int_t *vLines,int nIns,int nOuts,int nStates)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  int iOut;
  int iNext;
  int iCur;
  int iMint;
  int nDigits;
  int i;
  int nStates_local;
  int nOuts_local;
  int nIns_local;
  Vec_Int_t *vLines_local;
  FILE *pFile_local;
  
  uVar1 = Abc_Base10Log(nStates);
  iVar2 = Vec_IntSize(vLines);
  if (iVar2 % 4 != 0) {
    __assert_fail("Vec_IntSize(vLines) % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                  ,0x19a,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
  }
  iMint = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vLines);
    if (iVar2 <= iMint) {
      return;
    }
    iVar2 = Vec_IntEntry(vLines,iMint);
    iVar3 = Vec_IntEntry(vLines,iMint + 1);
    iVar4 = Vec_IntEntry(vLines,iMint + 2);
    iVar5 = Vec_IntEntry(vLines,iMint + 3);
    if ((iVar2 < 0) || (1 << ((byte)nIns & 0x1f) <= iVar2)) {
      __assert_fail("iMint >= 0 && iMint < (1<<nIns)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a1,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    if ((iVar3 + -1 < 0) || (nStates <= iVar3 + -1)) {
      __assert_fail("iCur >= 0 && iCur < nStates",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a2,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    if ((iVar4 + -1 < 0) || (nStates <= iVar4 + -1)) break;
    if ((iVar5 < 0) || (1 << ((byte)nOuts & 0x1f) <= iVar5)) {
      __assert_fail("iOut >= 0 && iOut < (1<<nOuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                    ,0x1a4,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
    }
    puVar7 = (uint *)Vec_IntEntryP(vLines,iMint);
    Extra_PrintBinary(pFile,puVar7,nIns);
    uVar6 = Vec_IntEntry(vLines,iMint + 1);
    fprintf((FILE *)pFile," %*d",(ulong)uVar1,(ulong)uVar6);
    uVar6 = Vec_IntEntry(vLines,iMint + 2);
    fprintf((FILE *)pFile," %*d ",(ulong)uVar1,(ulong)uVar6);
    puVar7 = (uint *)Vec_IntEntryP(vLines,iMint + 3);
    Extra_PrintBinary(pFile,puVar7,nOuts);
    fprintf((FILE *)pFile,"\n");
    iMint = iMint + 4;
  }
  __assert_fail("iNext >= 0 && iNext < nStates",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStg.c"
                ,0x1a3,"void Gia_ManStgPrint(FILE *, Vec_Int_t *, int, int, int)");
}

Assistant:

void Gia_ManStgPrint( FILE * pFile, Vec_Int_t * vLines, int nIns, int nOuts, int nStates )
{
    int i, nDigits = Abc_Base10Log( nStates );
    assert( Vec_IntSize(vLines) % 4 == 0 );
    for ( i = 0; i < Vec_IntSize(vLines); i += 4 )
    {
        int iMint = Vec_IntEntry(vLines, i  );
        int iCur  = Vec_IntEntry(vLines, i+1) - 1;
        int iNext = Vec_IntEntry(vLines, i+2) - 1;
        int iOut  = Vec_IntEntry(vLines, i+3);
        assert( iMint >= 0 && iMint < (1<<nIns)  );
        assert( iCur  >= 0 && iCur  < nStates    );
        assert( iNext >= 0 && iNext < nStates    );
        assert( iOut  >= 0 && iOut  < (1<<nOuts) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i),  nIns );
        fprintf( pFile, " %*d",  nDigits,     Vec_IntEntry(vLines,  i+1) );
        fprintf( pFile, " %*d ", nDigits,     Vec_IntEntry(vLines,  i+2) );
        Extra_PrintBinary( pFile, (unsigned *)Vec_IntEntryP(vLines, i+3), nOuts );
        fprintf( pFile, "\n" );
    }
}